

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplication::~QApplication(QApplication *this)

{
  QWidgetSet *pQVar1;
  bool bVar2;
  QApplicationPrivate *ctx;
  QObject *pQVar3;
  QGuiApplication *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QWidgetSet *mySet;
  QApplicationPrivate *d;
  ConstIterator cend;
  ConstIterator it;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
  *in_stack_ffffffffffffff58;
  const_iterator *in_stack_ffffffffffffff60;
  int line;
  QFont *file;
  QFont *this_00;
  QSet<QWidget_*> *in_stack_ffffffffffffff78;
  QWidget *this_01;
  char local_48 [32];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00d06320;
  ctx = d_func((QApplication *)0x2ca53e);
  qt_call_post_routines();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QCoreApplicationPrivate::is_app_closing._0_1_ = 1;
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  this_01 = (QWidget *)QWidgetPrivate::mapper;
  if (QWidgetPrivate::mapper != (QWidgetMapper *)0x0) {
    QHash<unsigned_long_long,_QWidget_*>::~QHash
              ((QHash<unsigned_long_long,_QWidget_*> *)in_stack_ffffffffffffff60);
    operator_delete(this_01,8);
  }
  pQVar1 = QWidgetPrivate::allWidgets;
  QWidgetPrivate::mapper = (QWidgetMapper *)0x0;
  if (QWidgetPrivate::allWidgets != (QWidgetSet *)0x0) {
    QWidgetPrivate::allWidgets = (QWidgetSet *)0x0;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QWidget_*>::constBegin(in_stack_ffffffffffffff78);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QSet<QWidget_*>::constEnd(in_stack_ffffffffffffff78);
    while (bVar2 = QSet<QWidget_*>::const_iterator::operator!=
                             (in_stack_ffffffffffffff60,(const_iterator *)in_stack_ffffffffffffff58)
          , bVar2) {
      QSet<QWidget_*>::const_iterator::operator*((const_iterator *)0x2ca670);
      pQVar3 = QObject::parent((QObject *)0x2ca682);
      if (pQVar3 == (QObject *)0x0) {
        QWidget::destroy(this_01,SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0));
      }
      QSet<QWidget_*>::const_iterator::operator++(in_stack_ffffffffffffff60);
    }
    if (pQVar1 != (QWidgetSet *)0x0) {
      QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x2ca6c4);
      operator_delete(pQVar1,8);
    }
  }
  if (qt_desktopWidget != (QWidget *)0x0) {
    (**(code **)(*(long *)qt_desktopWidget + 0x20))();
  }
  qt_desktopWidget = (QWidget *)0x0;
  QHash<QByteArray,_QPalette>::clear((QHash<QByteArray,_QPalette> *)in_stack_ffffffffffffff60);
  this_00 = QApplicationPrivate::sys_font;
  if (QApplicationPrivate::sys_font != (QFont *)0x0) {
    QFont::~QFont(QApplicationPrivate::sys_font);
    operator_delete(this_00,0x10);
  }
  QApplicationPrivate::sys_font = (QFont *)0x0;
  file = QApplicationPrivate::set_font;
  if (QApplicationPrivate::set_font != (QFont *)0x0) {
    QFont::~QFont(QApplicationPrivate::set_font);
    operator_delete(file,0x10);
  }
  QApplicationPrivate::set_font = (QFont *)0x0;
  bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::exists
                    ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>
                      *)0x2ca78d);
  if (bVar2) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_>::operator()
              (in_stack_ffffffffffffff58);
    QHash<QByteArray,_QFont>::clear((QHash<QByteArray,_QFont> *)in_stack_ffffffffffffff60);
  }
  if (QApplicationPrivate::app_style != (QStyle *)0x0) {
    (**(code **)(*(long *)QApplicationPrivate::app_style + 0x20))();
  }
  line = (int)((ulong)QApplicationPrivate::app_style >> 0x20);
  QApplicationPrivate::app_style = (QStyle *)0x0;
  if (((qt_is_tty_app & 1) == 0) &&
     (in_stack_ffffffffffffff58 =
           (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_> *)
           QDragManager::self(),
     in_stack_ffffffffffffff58 !=
     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_app_fonts>_> *)0x0)) {
    (**(code **)(*(long *)in_stack_ffffffffffffff58 + 0x20))();
  }
  QApplicationPrivate::cleanupMultitouch((QApplicationPrivate *)0x2ca806);
  QPixmapCache::clear();
  QColormap::cleanup((EVP_PKEY_CTX *)ctx);
  QApplicationPrivate::active_window = (QWidget *)0x0;
  if ((QApplicationPrivate::widgetCount & 1U) != 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)file,line,(char *)in_stack_ffffffffffffff58);
    QMessageLogger::debug
              (local_48,"Widgets left: %i    Max widgets: %i \n",
               (ulong)(uint)QWidgetPrivate::instanceCounter,
               (ulong)(uint)QWidgetPrivate::maxInstances);
  }
  QGuiApplicationPrivate::obey_desktop_settings._0_1_ = 1;
  QApplicationPrivate::enabledAnimations = 1;
  QApplicationPrivate::widgetCount = false;
  QGuiApplication::~QGuiApplication(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QApplication::~QApplication()
{
    Q_D(QApplication);

    //### this should probable be done even later
    qt_call_post_routines();

    // kill timers before closing down the dispatcher
    d->toolTipWakeUp.stop();
    d->toolTipFallAsleep.stop();

    QApplicationPrivate::is_app_closing = true;
    QApplicationPrivate::is_app_running = false;

    delete QWidgetPrivate::mapper;
    QWidgetPrivate::mapper = nullptr;

    // delete all widgets
    if (QWidgetPrivate::allWidgets) {
        QWidgetSet *mySet = QWidgetPrivate::allWidgets;
        QWidgetPrivate::allWidgets = nullptr;
        for (QWidgetSet::ConstIterator it = mySet->constBegin(), cend = mySet->constEnd(); it != cend; ++it) {
            QWidget *w = *it;
            if (!w->parent())                        // window
                w->destroy(true, true);
        }
        delete mySet;
    }

    delete qt_desktopWidget;
    qt_desktopWidget = nullptr;

    QApplicationPrivate::widgetPalettes.clear();

    delete QApplicationPrivate::sys_font;
    QApplicationPrivate::sys_font = nullptr;
    delete QApplicationPrivate::set_font;
    QApplicationPrivate::set_font = nullptr;
    if (app_fonts.exists())
        app_fonts()->clear();

    delete QApplicationPrivate::app_style;
    QApplicationPrivate::app_style = nullptr;

#if QT_CONFIG(draganddrop)
    if (!qt_is_tty_app)
        delete QDragManager::self();
#endif

    d->cleanupMultitouch();

    QPixmapCache::clear();
    QColormap::cleanup();

    QApplicationPrivate::active_window = nullptr; //### this should not be necessary

    if (QApplicationPrivate::widgetCount)
        qDebug("Widgets left: %i    Max widgets: %i \n", QWidgetPrivate::instanceCounter, QWidgetPrivate::maxInstances);

    QApplicationPrivate::obey_desktop_settings = true;

    QApplicationPrivate::enabledAnimations = QPlatformTheme::GeneralUiEffect;
    QApplicationPrivate::widgetCount = false;
}